

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::internal::ArgVisitor<fmt::internal::ArgFormatter<char>,_void>::visit
          (ArgVisitor<fmt::internal::ArgFormatter<char>,_void> *this,Arg *arg)

{
  unkbyte10 *pVar1;
  FormatSpec spec;
  FormatSpec spec_00;
  FormatSpec spec_01;
  FormatSpec spec_02;
  StringValue<char> local_18;
  undefined8 local_8;
  
  switch(arg->type) {
  case INT:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(char **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec._10_6_ = (int6)(local_18.size >> 0x10);
    spec.super_AlignSpec._0_10_ = *pVar1;
    spec.precision_ = (int)local_8;
    spec.type_ = (char)((ulong)local_8 >> 0x20);
    spec._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<char>::write_int<int,fmt::FormatSpec>
              (*(BasicWriter<char> **)this,(arg->super_Value).field_0.int_value,spec);
    break;
  case UINT:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(char **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec_01._10_6_ = (int6)(local_18.size >> 0x10);
    spec_01.super_AlignSpec._0_10_ = *pVar1;
    spec_01.precision_ = (int)local_8;
    spec_01.type_ = (char)((ulong)local_8 >> 0x20);
    spec_01._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<char>::write_int<unsigned_int,fmt::FormatSpec>
              (*(BasicWriter<char> **)this,(arg->super_Value).field_0.uint_value,spec_01);
    break;
  case LONG_LONG:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(char **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec_02._10_6_ = (int6)(local_18.size >> 0x10);
    spec_02.super_AlignSpec._0_10_ = *pVar1;
    spec_02.precision_ = (int)local_8;
    spec_02.type_ = (char)((ulong)local_8 >> 0x20);
    spec_02._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<char>::write_int<long_long,fmt::FormatSpec>
              (*(BasicWriter<char> **)this,(arg->super_Value).field_0.long_long_value,spec_02);
    break;
  case ULONG_LONG:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(char **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec_00._10_6_ = (int6)(local_18.size >> 0x10);
    spec_00.super_AlignSpec._0_10_ = *pVar1;
    spec_00.precision_ = (int)local_8;
    spec_00.type_ = (char)((ulong)local_8 >> 0x20);
    spec_00._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<char>::write_int<unsigned_long_long,fmt::FormatSpec>
              (*(BasicWriter<char> **)this,(arg->super_Value).field_0.ulong_long_value,spec_00);
    break;
  case BOOL:
    BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char>::visit_bool
              ((BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.int_value != 0);
    return;
  case CHAR:
    BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char>::visit_char
              ((BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.int_value);
    return;
  case DOUBLE:
    BasicWriter<char>::write_double<double>
              (*(BasicWriter<char> **)this,(arg->super_Value).field_0.double_value,
               *(FormatSpec **)(this + 8));
    return;
  case LAST_NUMERIC_TYPE:
    BasicWriter<char>::write_double<long_double>
              (*(BasicWriter<char> **)this,(arg->super_Value).field_0.long_double_value,
               *(FormatSpec **)(this + 8));
    break;
  case CSTRING:
    BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char>::visit_cstring
              ((BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.string.value);
    return;
  case STRING:
    local_18.value = (char *)(arg->super_Value).field_0.long_long_value;
    local_18.size = (arg->super_Value).field_0.string.size;
    BasicWriter<char>::write_str<char>
              (*(BasicWriter<char> **)this,&local_18,*(FormatSpec **)(this + 8));
    break;
  case WSTRING:
    break;
  case POINTER:
    BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char>::visit_pointer
              ((BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *)this,
               (arg->super_Value).field_0.pointer);
    return;
  case CUSTOM:
    (*(arg->super_Value).field_0.custom.format)
              (*(void **)(this + 0x10),(void *)(arg->super_Value).field_0.long_long_value,
               this + 0x18);
    return;
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::internal::ArgFormatter<char>, void>::visit(const Arg &) [Impl = fmt::internal::ArgFormatter<char>, Result = void]"
                 );
  }
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }